

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O2

void __thiscall Js::AsmJsEncoder::AddReloc(AsmJsEncoder *this,int labelOffset,BYTE *patchAddr)

{
  bool bVar1;
  undefined1 local_48 [8];
  EncoderRelocLabel newLabel;
  EncoderRelocLabel *label;
  int labelOffset_local;
  
  newLabel.relocList = (EncoderReloc *)0x0;
  label._4_4_ = labelOffset;
  bVar1 = JsUtil::
          BaseDictionary<int,_Js::AsmJsEncoder::EncoderRelocLabel,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>
                    (this->mRelocLabelMap,(int *)((long)&label + 4),
                     (EncoderRelocLabel **)&newLabel.relocList);
  if (bVar1) {
    EncoderReloc::New((EncoderRelocLabel *)newLabel.relocList,patchAddr,this->mPc,this->mLocalAlloc)
    ;
  }
  else {
    local_48[0] = 0;
    newLabel.pc = (BYTE *)0x0;
    EncoderReloc::New((EncoderRelocLabel *)local_48,patchAddr,this->mPc,this->mLocalAlloc);
    JsUtil::
    BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->mRelocLabelMap,(int *)((long)&label + 4),(EncoderRelocLabel *)local_48);
  }
  return;
}

Assistant:

void Js::AsmJsEncoder::AddReloc( const int labelOffset, BYTE* patchAddr )
    {
        EncoderRelocLabel* label = nullptr;
        if( mRelocLabelMap->TryGetReference( labelOffset, &label ) )
        {
            EncoderReloc::New( label, patchAddr, mPc, mLocalAlloc );
        }
        else
        {
            EncoderRelocLabel newLabel;
            EncoderReloc::New( &newLabel, patchAddr, mPc, mLocalAlloc );
            mRelocLabelMap->AddNew( labelOffset, newLabel );
        }
    }